

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O0

char * __thiscall duckdb::StrfTimeFormat::Write2(StrfTimeFormat *this,char *target,uint8_t value)

{
  byte in_DL;
  char *in_RSI;
  StrfTimeFormat *in_RDI;
  char *local_8;
  
  if (in_DL < 10) {
    *in_RSI = in_DL + 0x30;
    local_8 = in_RSI + 1;
  }
  else {
    local_8 = WritePadded2(in_RDI,in_RSI,(uint)in_DL);
  }
  return local_8;
}

Assistant:

char *StrfTimeFormat::Write2(char *target, uint8_t value) const {
	D_ASSERT(value < 100);
	if (value >= 10) {
		return WritePadded2(target, value);
	} else {
		*target = char(uint8_t('0') + value);
		return target + 1;
	}
}